

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * get_drive(char *path,char *dest)

{
  char *in_RSI;
  char *in_RDI;
  undefined8 local_8;
  
  if (in_RSI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    clear_path_string(in_RDI,(size_t)in_RSI);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

char *get_drive(const char *path, char *dest)
{
	if (dest == NULL)
	{
		return NULL;
	}
	clear_path_string(dest, MAX_PATH);
#if defined(_WIN32)
	char ch = path[0];
	if (path[1] == ':' && ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z')))
	{
		dest[0] = ch;
		dest[1] = ':';
		dest[2] = '\0';
	}
#endif
	return dest;
}